

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O1

void unruh_G(picnic_instance_t *pp,proof_round_t *prf_round,uint vidx,_Bool include_is)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint16_t data_le;
  uint8_t tmp [64];
  hash_context ctx;
  undefined2 local_15a;
  BitSequence local_158 [72];
  Keccak_HashInstance local_110;
  
  bVar1 = pp->digest_size;
  local_158[0] = '\x05';
  if (bVar1 == 0x20) {
    uVar3 = 0x540;
    uVar2 = 0x100;
  }
  else {
    uVar3 = 0x440;
    uVar2 = 0x200;
  }
  Keccak_HashInitialize(&local_110,uVar3,uVar2,0,'\x1f');
  Keccak_HashUpdate(&local_110,local_158,8);
  Keccak_HashUpdate(&local_110,prf_round->seeds[vidx],(ulong)pp->seed_size << 3);
  Keccak_HashFinal(&local_110,(BitSequence *)0x0);
  Keccak_HashSqueeze(&local_110,local_158,(ulong)((uint)bVar1 * 8));
  if (bVar1 == 0x20) {
    uVar3 = 0x540;
    uVar2 = 0x100;
  }
  else {
    uVar3 = 0x440;
    uVar2 = 0x200;
  }
  Keccak_HashInitialize(&local_110,uVar3,uVar2,0,'\x1f');
  Keccak_HashUpdate(&local_110,local_158,(ulong)((uint)bVar1 * 8));
  if (include_is) {
    Keccak_HashUpdate(&local_110,prf_round->input_shares[vidx],(ulong)pp->input_output_size << 3);
  }
  Keccak_HashUpdate(&local_110,prf_round->communicated_bits[vidx],(ulong)pp->view_size << 3);
  uVar2 = 0;
  if (include_is) {
    uVar2 = (uint)pp->input_output_size;
  }
  iVar4 = (uint)pp->view_size + (uint)pp->input_output_size + uVar2;
  local_15a = (undefined2)iVar4;
  Keccak_HashUpdate(&local_110,(BitSequence *)&local_15a,0x10);
  Keccak_HashFinal(&local_110,(BitSequence *)0x0);
  Keccak_HashSqueeze(&local_110,prf_round->gs[vidx],(ulong)(uint)(iVar4 * 8));
  return;
}

Assistant:

static void unruh_G(const picnic_instance_t* pp, proof_round_t* prf_round, unsigned int vidx,
                    bool include_is) {
  const unsigned int digest_size = pp->digest_size;

  // Hash the seed with H_5, store digest in output
  hash_context ctx;
  hash_init_prefix(&ctx, digest_size, HASH_PREFIX_5);
  hash_update(&ctx, prf_round->seeds[vidx], pp->seed_size);
  hash_final(&ctx);

  uint8_t tmp[MAX_DIGEST_SIZE];
  hash_squeeze(&ctx, tmp, digest_size);
  hash_clear(&ctx);

  // Hash H_5(seed), the view, and the length
  hash_init(&ctx, digest_size);
  hash_update(&ctx, tmp, digest_size);
  if (include_is) {
    hash_update(&ctx, prf_round->input_shares[vidx], pp->input_output_size);
  }
  hash_update(&ctx, prf_round->communicated_bits[vidx], pp->view_size);
  const unsigned int outputlen =
      pp->view_size + pp->input_output_size + (include_is ? pp->input_output_size : 0);
  hash_update_uint16_le(&ctx, outputlen);
  hash_final(&ctx);
  hash_squeeze(&ctx, prf_round->gs[vidx], outputlen);
  hash_clear(&ctx);
}